

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O3

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++:320:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_xthread_test_c__:320:17)>
             *this)

{
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *pOVar1;
  Disposer *pDVar2;
  PromiseFulfiller<void> *pPVar3;
  MutexGuarded<kj::Maybe<const_kj::Executor_&>_> *pMVar4;
  PromiseBase node;
  long *plVar5;
  WeakFulfiller<void> *params;
  Executor *pEVar6;
  WeakFulfillerBase *pWVar7;
  WaitScope waitScope;
  PredicateImpl_conflict impl;
  EventLoop loop;
  UnixEventPort port;
  undefined1 local_211;
  PromiseBase local_210;
  WeakFulfillerBase *local_208;
  long *local_200;
  char *local_1f8;
  char *pcStack_1f0;
  undefined8 local_1e8;
  EventLoop *local_1e0;
  undefined4 local_1d8;
  long local_1d0;
  undefined8 uStack_1c8;
  undefined **local_1c0;
  undefined1 *local_1b8;
  Maybe<const_kj::Executor_&> *local_1b0;
  undefined1 local_1a8;
  EventLoop local_198;
  UnixEventPort local_120;
  
  UnixEventPort::UnixEventPort(&local_120);
  EventLoop::EventLoop(&local_198,&local_120.super_EventPort);
  local_1d8 = 0xffffffff;
  local_1d0 = 0;
  uStack_1c8 = 0;
  local_1e0 = &local_198;
  EventLoop::enterScope(&local_198);
  params = (WeakFulfiller<void> *)operator_new(0x18);
  pWVar7 = &params->super_WeakFulfillerBase;
  (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  (params->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector =
       (_func_int **)&PTR_reject_00605058;
  (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_00605090;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<void>&>
            ((PromiseDisposer *)&local_210,params);
  pOVar1 = (this->f).fulfiller;
  pDVar2 = pOVar1->disposer;
  pPVar3 = pOVar1->ptr;
  pOVar1->disposer = &pWVar7->super_Disposer;
  pOVar1->ptr = (PromiseFulfiller<void> *)params;
  local_200 = (long *)0x0;
  local_208 = pWVar7;
  if (pPVar3 != (PromiseFulfiller<void> *)0x0) {
    (**pDVar2->_vptr_Disposer)();
  }
  pEVar6 = getCurrentThreadExecutor();
  pMVar4 = (this->f).executor;
  local_1c0 = (undefined **)((ulong)local_1c0 & 0xffffffffffffff00);
  kj::_::Mutex::lock(&pMVar4->mutex);
  (pMVar4->value).ptr = pEVar6;
  kj::_::Mutex::unlock(&pMVar4->mutex,EXCLUSIVE,(Waiter *)0x0);
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
  ;
  pcStack_1f0 = "operator()";
  local_1e8 = 0x500000148;
  Promise<void>::wait((Promise<void> *)&local_210,&local_1e0);
  pMVar4 = (this->f).executor;
  local_1c0 = (undefined **)((ulong)local_1c0 & 0xffffffffffffff00);
  kj::_::Mutex::lock(&pMVar4->mutex,0);
  local_1b0 = &pMVar4->value;
  local_1c0 = &PTR_check_0060af50;
  local_1b8 = &local_211;
  local_1a8 = 0;
  kj::_::Mutex::wait(&pMVar4->mutex,&local_1c0);
  kj::_::Mutex::unlock(&pMVar4->mutex,EXCLUSIVE,(Waiter *)0x0);
  plVar5 = local_200;
  if (local_200 != (long *)0x0) {
    local_200 = (long *)0x0;
    (**(local_208->super_Disposer)._vptr_Disposer)
              (local_208,(long)plVar5 + *(long *)(*plVar5 + -0x10));
  }
  node.node.ptr = local_210.node.ptr;
  if (local_210.node.ptr != (PromiseNode *)0x0) {
    local_210.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.node.ptr);
  }
  if (local_1d0 == 0) {
    EventLoop::leaveScope(local_1e0);
  }
  EventLoop::~EventLoop(&local_198);
  UnixEventPort::~UnixEventPort(&local_120);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }